

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t32.inc.c
# Opt level: O0

void disas_t32_extract_ldst_ri_unp(DisasContext_conflict1 *ctx,arg_ldst_ri *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,0xc,4);
  a->rt = uVar1;
  uVar1 = extract32(insn,0,8);
  a->imm = uVar1;
  a->p = 1;
  a->w = 0;
  a->u = 1;
  return;
}

Assistant:

static void disas_t32_extract_ldst_ri_unp(DisasContext *ctx, arg_ldst_ri *a, uint32_t insn)
{
    a->rn = extract32(insn, 16, 4);
    a->rt = extract32(insn, 12, 4);
    a->imm = extract32(insn, 0, 8);
    a->p = 1;
    a->w = 0;
    a->u = 1;
}